

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

String * __thiscall
kj::str<kj::Maybe<kj::_::(anonymous_namespace)::Stringable>&>
          (String *__return_storage_ptr__,kj *this,
          Maybe<kj::_::(anonymous_namespace)::Stringable> *params)

{
  Array<char> local_38;
  char *local_18;
  undefined8 local_10;
  
  if (*this == (kj)0x1) {
    local_18 = "foo";
    local_10 = 4;
    _::concat<kj::StringPtr>((String *)&local_38,(_ *)&local_18,(StringPtr *)params);
  }
  else {
    str<char_const(&)[7]>((String *)&local_38,(kj *)"(none)",(char (*) [7])params);
  }
  (__return_storage_ptr__->content).ptr = local_38.ptr;
  (__return_storage_ptr__->content).size_ = local_38.size_;
  (__return_storage_ptr__->content).disposer = local_38.disposer;
  local_38.ptr = (char *)0x0;
  local_38.size_ = 0;
  Array<char>::~Array(&local_38);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}